

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_free_withsiblings(lyd_node *node)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  lyd_node *node_00;
  
  if (node != (lyd_node *)0x0) {
    plVar1 = node->prev->next;
    node_00 = node->prev;
    while (plVar1 != (lyd_node *)0x0) {
      plVar2 = node_00->prev;
      lyd_free(node_00);
      node_00 = plVar2;
      plVar1 = plVar2->next;
    }
    while (node != (lyd_node *)0x0) {
      plVar1 = node->next;
      lyd_free(node);
      node = plVar1;
    }
  }
  return;
}

Assistant:

API void
lyd_free_withsiblings(struct lyd_node *node)
{
    struct lyd_node *iter, *aux;

    if (!node) {
        return;
    }

    /* optimization - avoid freeing (unlinking) the last node of the siblings list */
    /* so, first, free the node's predecessors to the beginning of the list ... */
    for(iter = node->prev; iter->next; iter = aux) {
        aux = iter->prev;
        lyd_free(iter);
    }
    /* ... then, the node is the first in the siblings list, so free them all */
    LY_TREE_FOR_SAFE(node, aux, iter) {
        lyd_free(iter);
    }
}